

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_ptr.h
# Opt level: O2

void __thiscall
booster::intrusive_ptr<nonblocking_unit_test::binder>::~intrusive_ptr
          (intrusive_ptr<nonblocking_unit_test::binder> *this)

{
  if (this->p_ != (binder *)0x0) {
    intrusive_ptr_release((refcounted *)this->p_);
  }
  return;
}

Assistant:

~intrusive_ptr()
    {
        if(p_ != 0) intrusive_ptr_release(p_);
    }